

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_data.c
# Opt level: O3

void fiobj_data_assert_dynamic(FIOBJ io)

{
  char cVar1;
  int *piVar2;
  
  if (io == 0) {
    piVar2 = __errno_location();
    *piVar2 = 0x17;
    return;
  }
  if ((io & 1) == 0) {
    switch((uint)io & 6) {
    case 0:
      cVar1 = *(char *)(io & 0xfffffffffffffff8);
      break;
    default:
      goto switchD_00141559_caseD_2;
    case 6:
      cVar1 = (char)io;
    }
    if (cVar1 == '+') {
      fiobj_data_pre_write(io,0);
      return;
    }
  }
switchD_00141559_caseD_2:
  __assert_fail("FIOBJ_TYPE(io) == FIOBJ_T_DATA",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_data.c"
                ,0x3ad,"void fiobj_data_assert_dynamic(FIOBJ)");
}

Assistant:

void fiobj_data_assert_dynamic(FIOBJ io) {
  if (!io) {
    errno = ENFILE;
    return;
  }
  assert(FIOBJ_TYPE(io) == FIOBJ_T_DATA);
  fiobj_data_pre_write(io, 0);
  return;
}